

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_rectangle_rounded(rf_rec rec,float roundness,int segments,rf_color color)

{
  float x;
  float y;
  uchar y_00;
  uchar z;
  _Bool _Var1;
  uchar x_00;
  ulong uVar2;
  ulong uVar3;
  uchar w;
  bool bVar4;
  float x_01;
  float fVar5;
  float fVar6;
  float fVar7;
  float y_01;
  float fVar8;
  float fVar9;
  float y_02;
  float fVar10;
  float x_02;
  float y_03;
  float local_f0;
  undefined8 local_58;
  float local_50;
  float local_4c;
  undefined8 local_48;
  float local_40;
  float local_3c;
  ulong local_38;
  
  fVar8 = rec.width;
  fVar9 = rec.height;
  x_01 = rec.x;
  y_01 = rec.y;
  if (((0.0 < roundness) && (1.0 <= fVar8)) && (1.0 <= fVar9)) {
    fVar10 = 1.0;
    if (roundness <= 1.0) {
      fVar10 = roundness;
    }
    fVar5 = fVar9;
    if (fVar8 <= fVar9) {
      fVar5 = fVar8;
    }
    fVar10 = fVar5 * fVar10 * 0.5;
    if (0.0 < fVar10) {
      y_00 = color.g;
      z = color.b;
      if (segments < 4) {
        fVar5 = -0.5 / fVar10 + 1.0;
        fVar5 = fVar5 * fVar5;
        fVar5 = acosf(fVar5 + fVar5 + -1.0);
        fVar5 = ceilf(6.2831855 / fVar5);
        segments = 4;
        if (0 < (int)(fVar5 * 0.25)) {
          segments = (int)(fVar5 * 0.25);
        }
      }
      fVar8 = fVar8 + x_01;
      fVar9 = fVar9 + y_01;
      x_02 = x_01 + fVar10;
      y_03 = y_01 + fVar10;
      local_58 = CONCAT44(y_03,x_02);
      fVar5 = fVar8 - fVar10;
      y_02 = fVar9 - fVar10;
      local_48 = CONCAT44(y_02,fVar5);
      local_50 = fVar5;
      local_4c = y_03;
      local_40 = x_02;
      local_3c = y_02;
      _Var1 = rf_gfx_check_buffer_limit(segments * 0xc + 0x1e);
      if (_Var1) {
        rf_gfx_draw();
      }
      rf_gfx_begin(RF_TRIANGLES);
      uVar3 = 0;
      local_38 = (ulong)(uint)segments;
      if (segments < 1) {
        local_38 = uVar3;
      }
      x_00 = color.r;
      w = color.a;
      for (; uVar3 != 4; uVar3 = uVar3 + 1) {
        local_f0 = (float)(&DAT_00170050)[uVar3];
        x = *(float *)(&local_58 + uVar3);
        y = *(float *)((long)&local_58 + uVar3 * 8 + 4);
        uVar2 = local_38;
        while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
          rf_gfx_color4ub(x_00,y_00,z,w);
          rf_gfx_vertex2f(x,y);
          fVar6 = sinf(local_f0 * 0.017453292);
          fVar7 = cosf(local_f0 * 0.017453292);
          rf_gfx_vertex2f(fVar6 * fVar10 + x,fVar7 * fVar10 + y);
          local_f0 = local_f0 + 90.0 / (float)segments;
          fVar6 = sinf(local_f0 * 0.017453292);
          fVar7 = cosf(local_f0 * 0.017453292);
          rf_gfx_vertex2f(fVar6 * fVar10 + x,fVar7 * fVar10 + y);
        }
      }
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex2f(x_02,y_01);
      rf_gfx_vertex2f(x_02,y_03);
      rf_gfx_vertex2f(fVar5,y_03);
      rf_gfx_vertex2f(fVar5,y_01);
      rf_gfx_vertex2f(x_02,y_01);
      rf_gfx_vertex2f(fVar5,y_03);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex2f(fVar5,y_03);
      rf_gfx_vertex2f(fVar5,y_02);
      rf_gfx_vertex2f(fVar8,y_02);
      rf_gfx_vertex2f(fVar8,y_03);
      rf_gfx_vertex2f(fVar5,y_03);
      rf_gfx_vertex2f(fVar8,y_02);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_vertex2f(x_02,fVar9);
      rf_gfx_vertex2f(fVar5,fVar9);
      rf_gfx_vertex2f(fVar5,y_02);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_vertex2f(fVar5,fVar9);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex2f(x_01,y_03);
      rf_gfx_vertex2f(x_01,y_02);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_vertex2f(x_02,y_03);
      rf_gfx_vertex2f(x_01,y_03);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_color4ub(x_00,y_00,z,w);
      rf_gfx_vertex2f(x_02,y_03);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_vertex2f(fVar5,y_02);
      rf_gfx_vertex2f(fVar5,y_03);
      rf_gfx_vertex2f(x_02,y_03);
      rf_gfx_vertex2f(fVar5,y_02);
      rf_gfx_end();
    }
    return;
  }
  rf_draw_rectangle_pro(rec,(rf_vec2)0x0,0.0,color);
  return;
}

Assistant:

RF_API void rf_draw_rectangle_rounded(rf_rec rec, float roundness, int segments, rf_color color)
{
    // Not a rounded rectangle
    if ((roundness <= 0.0f) || (rec.width < 1) || (rec.height < 1 ))
    {
        rf_draw_rectangle_pro(rec, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = ceilf(2 * RF_PI / th) / 4;
        if (segments <= 0) segments = 4;
    }

    float step_length = 90.0f/(float)segments;

    /*  Quick sketch to make sense of all of this (there are 9 parts to draw, also mark the 12 points we'll use below)
     *  Not my best attempt at ASCII art, just preted it's rounded rectangle :)
     *     P0                    P1
     *       ____________________
     *     /|                    |\
     *    /1|          2         |3\
     *P7 /__|____________________|__\ P2
     *  /   |                    |  _\ P2
     *  |   |P8                P9|   |
     *  | 8 |          9         | 4 |
     *  | __|____________________|__ |
     *P6 \  |P11              P10|  / P3
     *    \7|          6         |5/
     *     \|____________________|/
     *     P5                    P4
     */

    const rf_vec2 point[12] = { // coordinates of the 12 points that define the rounded rect (the idea here is to make things easier)
            {(float)rec.x + radius, rec.y}, {(float)(rec.x + rec.width) - radius, rec.y}, { rec.x + rec.width, (float)rec.y + radius }, // PO, P1, P2
            {rec.x + rec.width, (float)(rec.y + rec.height) - radius}, {(float)(rec.x + rec.width) - radius, rec.y + rec.height}, // P3, P4
            {(float)rec.x + radius, rec.y + rec.height}, { rec.x, (float)(rec.y + rec.height) - radius}, {rec.x, (float)rec.y + radius}, // P5, P6, P7
            {(float)rec.x + radius, (float)rec.y + radius}, {(float)(rec.x + rec.width) - radius, (float)rec.y + radius}, // P8, P9
            {(float)(rec.x + rec.width) - radius, (float)(rec.y + rec.height) - radius}, {(float)rec.x + radius, (float)(rec.y + rec.height) - radius} // P10, P11
    };

    const rf_vec2 centers[4] = {point[8], point[9], point[10], point[11] };
    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };
    if (rf_gfx_check_buffer_limit(12*segments + 5*6)) rf_gfx_draw(); // 4 corners with 3 vertices per segment + 5 rectangles with 6 vertices each

    rf_gfx_begin(RF_TRIANGLES);
    // Draw all of the 4 corners: [1] Upper Left Corner, [3] Upper Right Corner, [5] Lower Right Corner, [7] Lower Left Corner
    for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
    {
        float angle = angles[k];
        const rf_vec2 center = centers[k];
        for (rf_int i = 0; i < segments; i++)
        {
            rf_gfx_color4ub(color.r, color.g, color.b, color.a);
            rf_gfx_vertex2f(center.x, center.y);
            rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
            rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);
            angle += step_length;
        }
    }

    // [2] Upper rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[0].x, point[0].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[1].x, point[1].y);
    rf_gfx_vertex2f(point[0].x, point[0].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);

    // [4] Right rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[3].x, point[3].y);
    rf_gfx_vertex2f(point[2].x, point[2].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[3].x, point[3].y);

    // [6] Bottom rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[5].x, point[5].y);
    rf_gfx_vertex2f(point[4].x, point[4].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[4].x, point[4].y);

    // [8] Left rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[7].x, point[7].y);
    rf_gfx_vertex2f(point[6].x, point[6].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[7].x, point[7].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);

    // [9] Middle rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_end();

}